

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

void tcu::lookupQuad(ColorQuad *dst,ConstPixelBufferAccess *level,Sampler *sampler,int x0,int x1,
                    int y0,int y1,int z)

{
  bool bVar1;
  int x;
  TextureFormat local_58;
  int aiStack_50 [4];
  TextureFormat local_40;
  int aiStack_38 [2];
  
  x = (int)level;
  if ((((x0 < 0) || ((level->m_size).m_data[0] <= x0)) || (y0 < 0)) ||
     ((((level->m_size).m_data[1] <= y0 || (z < 0)) || ((level->m_size).m_data[2] <= z)))) {
    sampleTextureBorder<float>(&local_58,(Sampler *)level);
  }
  else {
    ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_40,x,x0,y0);
    bVar1 = isSRGB(level->m_format);
    if (bVar1) {
      sRGBToLinear((tcu *)&local_58,(Vec4 *)&local_40);
    }
    else {
      local_58 = local_40;
      aiStack_50[0] = aiStack_38[0];
      aiStack_50[1] = aiStack_38[1];
    }
  }
  (dst->p00).m_data[0] = (float)local_58.order;
  (dst->p00).m_data[1] = (float)local_58.type;
  *(undefined8 *)((dst->p00).m_data + 2) = aiStack_50._0_8_;
  if (((x1 < 0) || ((level->m_size).m_data[0] <= x1)) ||
     ((y0 < 0 ||
      ((((level->m_size).m_data[1] <= y0 || (z < 0)) || ((level->m_size).m_data[2] <= z)))))) {
    sampleTextureBorder<float>(&local_58,(Sampler *)level);
  }
  else {
    ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_40,x,x1,y0);
    bVar1 = isSRGB(level->m_format);
    if (bVar1) {
      sRGBToLinear((tcu *)&local_58,(Vec4 *)&local_40);
    }
    else {
      local_58 = local_40;
      aiStack_50[0] = aiStack_38[0];
      aiStack_50[1] = aiStack_38[1];
    }
  }
  (dst->p10).m_data[0] = (float)local_58.order;
  (dst->p10).m_data[1] = (float)local_58.type;
  *(undefined8 *)((dst->p10).m_data + 2) = aiStack_50._0_8_;
  if (((x0 < 0) || ((level->m_size).m_data[0] <= x0)) ||
     (((y1 < 0 || (((level->m_size).m_data[1] <= y1 || (z < 0)))) ||
      ((level->m_size).m_data[2] <= z)))) {
    sampleTextureBorder<float>(&local_58,(Sampler *)level);
  }
  else {
    ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_40,x,x0,y1);
    bVar1 = isSRGB(level->m_format);
    if (bVar1) {
      sRGBToLinear((tcu *)&local_58,(Vec4 *)&local_40);
    }
    else {
      local_58 = local_40;
      aiStack_50[0] = aiStack_38[0];
      aiStack_50[1] = aiStack_38[1];
    }
  }
  (dst->p01).m_data[0] = (float)local_58.order;
  (dst->p01).m_data[1] = (float)local_58.type;
  *(undefined8 *)((dst->p01).m_data + 2) = aiStack_50._0_8_;
  if (((((x1 < 0) || ((level->m_size).m_data[0] <= x1)) || (y1 < 0)) ||
      (((level->m_size).m_data[1] <= y1 || (z < 0)))) || ((level->m_size).m_data[2] <= z)) {
    sampleTextureBorder<float>(&local_58,(Sampler *)level);
  }
  else {
    ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_40,x,x1,y1);
    bVar1 = isSRGB(level->m_format);
    if (bVar1) {
      sRGBToLinear((tcu *)&local_58,(Vec4 *)&local_40);
    }
    else {
      local_58 = local_40;
      aiStack_50[0] = aiStack_38[0];
      aiStack_50[1] = aiStack_38[1];
    }
  }
  (dst->p11).m_data[0] = (float)local_58.order;
  (dst->p11).m_data[1] = (float)local_58.type;
  *(undefined8 *)((dst->p11).m_data + 2) = aiStack_50._0_8_;
  return;
}

Assistant:

static void lookupQuad (ColorQuad& dst, const ConstPixelBufferAccess& level, const Sampler& sampler, int x0, int x1, int y0, int y1, int z)
{
	dst.p00	= lookup<float>(level, sampler, x0, y0, z);
	dst.p10	= lookup<float>(level, sampler, x1, y0, z);
	dst.p01	= lookup<float>(level, sampler, x0, y1, z);
	dst.p11	= lookup<float>(level, sampler, x1, y1, z);
}